

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_libapi.cpp
# Opt level: O0

ze_result_t
zeDeviceGetExternalMemoryProperties
          (ze_device_handle_t hDevice,
          ze_device_external_memory_properties_t *pExternalMemoryProperties)

{
  ze_pfnDeviceGetExternalMemoryProperties_t p_Var1;
  __pointer_type p_Var2;
  ze_pfnDeviceGetExternalMemoryProperties_t pfnGetExternalMemoryProperties;
  ze_device_external_memory_properties_t *pExternalMemoryProperties_local;
  ze_device_handle_t hDevice_local;
  
  if ((ze_lib::destruction & 1) == 0) {
    p_Var2 = std::atomic<_ze_dditable_t_*>::load
                       ((atomic<_ze_dditable_t_*> *)(ze_lib::context + 0x10),memory_order_seq_cst);
    p_Var1 = (p_Var2->Device).pfnGetExternalMemoryProperties;
    if (p_Var1 == (ze_pfnDeviceGetExternalMemoryProperties_t)0x0) {
      if ((*(byte *)(ze_lib::context + 0xd90) & 1) == 0) {
        hDevice_local._4_4_ = ZE_RESULT_ERROR_UNINITIALIZED;
      }
      else {
        hDevice_local._4_4_ = ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;
      }
    }
    else {
      hDevice_local._4_4_ = (*p_Var1)(hDevice,pExternalMemoryProperties);
    }
  }
  else {
    hDevice_local._4_4_ = ZE_RESULT_ERROR_UNINITIALIZED;
  }
  return hDevice_local._4_4_;
}

Assistant:

ze_result_t ZE_APICALL
zeDeviceGetExternalMemoryProperties(
    ze_device_handle_t hDevice,                     ///< [in] handle of the device
    ze_device_external_memory_properties_t* pExternalMemoryProperties   ///< [in,out] query result for external memory properties
    )
{
    #ifdef DYNAMIC_LOAD_LOADER
    ze_result_t result = ZE_RESULT_SUCCESS;
    if(ze_lib::destruction) {
        return ZE_RESULT_ERROR_UNINITIALIZED;
    }
    static const ze_pfnDeviceGetExternalMemoryProperties_t pfnGetExternalMemoryProperties = [&result] {
        auto pfnGetExternalMemoryProperties = ze_lib::context->zeDdiTable.load()->Device.pfnGetExternalMemoryProperties;
        if( nullptr == pfnGetExternalMemoryProperties ) {
            result = ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;
        }
        return pfnGetExternalMemoryProperties;
    }();
    if (result != ZE_RESULT_SUCCESS) {
        return result;
    }
    return pfnGetExternalMemoryProperties( hDevice, pExternalMemoryProperties );
    #else
    if(ze_lib::destruction) {
        return ZE_RESULT_ERROR_UNINITIALIZED;
    }

    auto pfnGetExternalMemoryProperties = ze_lib::context->zeDdiTable.load()->Device.pfnGetExternalMemoryProperties;
    if( nullptr == pfnGetExternalMemoryProperties ) {
        if(!ze_lib::context->isInitialized)
            return ZE_RESULT_ERROR_UNINITIALIZED;
        else
            return ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;
    }

    return pfnGetExternalMemoryProperties( hDevice, pExternalMemoryProperties );
    #endif
}